

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Document::ReadConnections(Document *this)

{
  bool bVar1;
  Element *pEVar2;
  Scope *pSVar3;
  _Base_ptr this_00;
  reference ppVar4;
  Token *pTVar5;
  Connection *this_01;
  Token *t;
  Token *t_00;
  ElementCollection EVar6;
  pair<const_unsigned_long,_const_Assimp::FBX::Connection_*> local_1e8;
  _Base_ptr local_1d8;
  pair<const_unsigned_long,_const_Assimp::FBX::Connection_*> local_1d0;
  Connection *local_1c0;
  Connection *c;
  string local_1b0;
  _Self local_190;
  _Self local_188;
  allocator<char> local_179;
  string local_178;
  _Self local_158;
  _Self local_150;
  byte local_142;
  allocator<char> local_141;
  string local_140;
  string *local_120;
  string *prop;
  uint64_t dest;
  uint64_t src;
  string local_100;
  string *local_e0;
  string *type;
  Element *el;
  const_iterator it;
  string local_c0;
  Element *local_a0;
  ElementCollection conns;
  Scope *sconns;
  uint64_t insertionOrder;
  string local_78;
  allocator<char> local_41;
  string local_40;
  Element *local_20;
  Element *econns;
  Scope *sc;
  Document *this_local;
  
  sc = (Scope *)this;
  pEVar2 = (Element *)Parser::GetRootScope(this->parser);
  econns = pEVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Connections",&local_41);
  pEVar2 = Scope::operator[]((Scope *)pEVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pEVar2;
  if ((pEVar2 != (Element *)0x0) && (pSVar3 = Element::Compound(pEVar2), pSVar3 != (Scope *)0x0)) {
    sconns = (Scope *)0x0;
    this_00 = (_Base_ptr)Element::Compound(local_20);
    conns.second._M_node = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"C",(allocator<char> *)((long)&it._M_node + 7));
    EVar6 = Scope::GetCollection((Scope *)this_00,&local_c0);
    conns.first = EVar6.second._M_node;
    local_a0 = (Element *)EVar6.first._M_node;
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
    el = local_a0;
    while (bVar1 = std::operator!=((_Self *)&el,&conns.first), bVar1) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                            *)&el);
      type = (string *)ppVar4->second;
      pTVar5 = GetRequiredToken((Element *)type,0);
      ParseTokenAsString_abi_cxx11_(&local_100,(FBX *)pTVar5,t);
      local_e0 = &local_100;
      bVar1 = std::operator==(&local_100,"PP");
      if (bVar1) {
        src._4_4_ = 4;
      }
      else {
        pTVar5 = GetRequiredToken((Element *)type,1);
        dest = ParseTokenAsID(pTVar5);
        pTVar5 = GetRequiredToken((Element *)type,2);
        prop = (string *)ParseTokenAsID(pTVar5);
        local_142 = 0;
        bVar1 = std::operator==(local_e0,"OP");
        if (bVar1) {
          pTVar5 = GetRequiredToken((Element *)type,3);
          ParseTokenAsString_abi_cxx11_(&local_140,(FBX *)pTVar5,t_00);
        }
        else {
          std::allocator<char>::allocator();
          local_142 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_141);
        }
        if ((local_142 & 1) != 0) {
          std::allocator<char>::~allocator(&local_141);
        }
        local_120 = &local_140;
        local_150._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
             ::find(&this->objects,&dest);
        local_158._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
             ::end(&this->objects);
        bVar1 = std::operator==(&local_150,&local_158);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,"source object for connection does not exist",&local_179);
          Util::DOMWarning(&local_178,(Element *)type);
          std::__cxx11::string::~string((string *)&local_178);
          std::allocator<char>::~allocator(&local_179);
          src._4_4_ = 4;
        }
        else {
          local_188._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
               ::find(&this->objects,(key_type_conflict *)&prop);
          local_190._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_Assimp::FBX::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
               ::end(&this->objects);
          bVar1 = std::operator==(&local_188,&local_190);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1b0,"destination object for connection does not exist",
                       (allocator<char> *)((long)&c + 7));
            Util::DOMWarning(&local_1b0,(Element *)type);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&c + 7));
            src._4_4_ = 4;
          }
          else {
            this_01 = (Connection *)operator_new(0x40);
            Connection::Connection(this_01,(uint64_t)sconns,dest,(uint64_t)prop,local_120,this);
            local_1c0 = this_01;
            std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>::
            pair<const_unsigned_long,_const_Assimp::FBX::Connection_*,_true>
                      (&local_1d0,&dest,&local_1c0);
            local_1d8 = (_Base_ptr)
                        std::
                        multimap<unsigned_long,_const_Assimp::FBX::Connection_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
                        ::insert(&this->src_connections,&local_1d0);
            std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>::
            pair<const_unsigned_long,_const_Assimp::FBX::Connection_*,_true>
                      (&local_1e8,(unsigned_long *)&prop,&local_1c0);
            std::
            multimap<unsigned_long,_const_Assimp::FBX::Connection_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
            ::insert(&this->dest_connections,&local_1e8);
            src._4_4_ = 0;
            sconns = (Scope *)&(sconns->elements)._M_t._M_impl.field_0x1;
          }
        }
        std::__cxx11::string::~string((string *)&local_140);
      }
      std::__cxx11::string::~string((string *)&local_100);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
                    *)&el);
    }
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"no Connections dictionary found",
             (allocator<char> *)((long)&insertionOrder + 7));
  Util::DOMError(&local_78,(Element *)0x0);
}

Assistant:

void Document::ReadConnections()
{
    const Scope& sc = parser.GetRootScope();
    // read property templates from "Definitions" section
    const Element* const econns = sc["Connections"];
    if(!econns || !econns->Compound()) {
        DOMError("no Connections dictionary found");
    }

    uint64_t insertionOrder = 0l;
    const Scope& sconns = *econns->Compound();
    const ElementCollection conns = sconns.GetCollection("C");
    for(ElementMap::const_iterator it = conns.first; it != conns.second; ++it) {
        const Element& el = *(*it).second;
        const std::string& type = ParseTokenAsString(GetRequiredToken(el,0));

        // PP = property-property connection, ignored for now
        // (tokens: "PP", ID1, "Property1", ID2, "Property2")
        if ( type == "PP" ) {
            continue;
        }

        const uint64_t src = ParseTokenAsID(GetRequiredToken(el,1));
        const uint64_t dest = ParseTokenAsID(GetRequiredToken(el,2));

        // OO = object-object connection
        // OP = object-property connection, in which case the destination property follows the object ID
        const std::string& prop = (type == "OP" ? ParseTokenAsString(GetRequiredToken(el,3)) : "");

        if(objects.find(src) == objects.end()) {
            DOMWarning("source object for connection does not exist",&el);
            continue;
        }

        // dest may be 0 (root node) but we added a dummy object before
        if(objects.find(dest) == objects.end()) {
            DOMWarning("destination object for connection does not exist",&el);
            continue;
        }

        // add new connection
        const Connection* const c = new Connection(insertionOrder++,src,dest,prop,*this);
        src_connections.insert(ConnectionMap::value_type(src,c));
        dest_connections.insert(ConnectionMap::value_type(dest,c));
    }
}